

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O0

bool __thiscall
pegmatite::ASTString::construct
          (ASTString *this,InputRange *r,ASTStack *param_2,ErrorReporter *param_3)

{
  string local_210 [32];
  stringstream *local_1f0;
  stringstream *local_1e8;
  iterator local_1e0;
  iterator local_1c0;
  stringstream local_1b0 [8];
  stringstream stream;
  ErrorReporter *param_3_local;
  ASTStack *param_2_local;
  InputRange *r_local;
  ASTString *this_local;
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  local_1c0 = InputRange::begin(r);
  local_1e0 = InputRange::end(r);
  local_1e8 = (stringstream *)local_1b0;
  local_1f0 = (stringstream *)
              std::
              for_each<pegmatite::Input::iterator,pegmatite::ASTString::construct(pegmatite::InputRange_const&,std::vector<std::pair<pegmatite::InputRange_const,std::unique_ptr<pegmatite::ASTNode,std::default_delete<pegmatite::ASTNode>>>,std::allocator<std::pair<pegmatite::InputRange_const,std::unique_ptr<pegmatite::ASTNode,std::default_delete<pegmatite::ASTNode>>>>>&,std::function<void(pegmatite::InputRange_const&,std::__cxx11::string_const&)>const&)::__0>
                        (local_1c0,local_1e0,(anon_class_8_1_6bf940be)local_1e8);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)&this->super_string,local_210);
  std::__cxx11::string::~string(local_210);
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return true;
}

Assistant:

bool ASTString::construct(const pegmatite::InputRange &r, pegmatite::ASTStack &,
                          const ErrorReporter &)
{
	std::stringstream stream;
	std::for_each(r.begin(),
	         r.end(),
	         [&](char32_t c) {stream << static_cast<char>(c);});
	this->std::string::operator=(stream.str());

	return true;
}